

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O0

QChar * QIPAddressUtils::parseIp6(IPv6Address *address,QChar *begin,QChar *end)

{
  bool bVar1;
  char *pcVar2;
  QChar *in_RDX;
  long lVar3;
  int iVar4;
  long in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar5;
  quint16 x;
  int pos;
  int zeroWordsToFill;
  int dotCount;
  int colonCount;
  char *stop;
  char *ptr;
  QChar *ret;
  IPv4Address ip4;
  unsigned_long_long ll;
  Buffer buffer;
  QVarLengthArray<char,_64LL> *in_stack_fffffffffffffe80;
  QChar *local_178;
  undefined8 in_stack_fffffffffffffe90;
  QChar *in_stack_fffffffffffffe98;
  QChar *in_stack_fffffffffffffea0;
  Buffer *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  qsizetype in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  char *local_c0;
  QChar *local_88;
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVarLengthArray<char,_64LL>::QVarLengthArray((QVarLengthArray<char,_64LL> *)local_68);
  local_88 = checkedToAscii(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe98);
  if (local_88 == (QChar *)0x0) {
    local_c0 = QVLABase<char>::data((QVLABase<char> *)local_68);
    QVLABaseBase::size((QVLABaseBase *)local_68);
    local_cc = 0;
    local_d0 = 0;
    for (; *local_c0 != '\0'; local_c0 = local_c0 + 1) {
      if (*local_c0 == ':') {
        local_cc = local_cc + 1;
      }
      if (*local_c0 == '.') {
        local_d0 = local_d0 + 1;
      }
    }
    local_88 = in_RDX;
    if ((local_d0 == 0) || (local_d0 == 3)) {
      memset(in_RDI,0,0x10);
      if ((local_cc == 2) && ((long)in_RDX - in_RSI >> 1 == 2)) {
        local_88 = (QChar *)0x0;
      }
      else {
        local_c0 = QVLABase<char>::data((QVLABase<char> *)local_68);
        if (((*local_c0 == ':') && (local_c0[1] == ':')) ||
           ((local_c0[((long)in_RDX - in_RSI >> 1) + -2] == ':' &&
            (local_c0[((long)in_RDX - in_RSI >> 1) + -1] == ':')))) {
          local_d4 = 9 - local_cc;
        }
        else {
          if ((local_cc < 2) || (7 < local_cc)) goto LAB_002cd6bf;
          local_d4 = 8 - local_cc;
        }
        if (local_d0 != 0) {
          local_d4 = local_d4 + -1;
        }
        local_d8 = 0;
        while (local_d8 < 0xf) {
          if (*local_c0 == ':') {
            if (local_d4 < 1) {
              pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_68);
              local_88 = (QChar *)(in_RSI + ((long)local_c0 - (long)pcVar2) * 2);
              goto LAB_002cd6bf;
            }
            if ((local_d8 == 0) || (local_d8 == local_cc * 2)) {
              if ((*local_c0 == '\0') || (local_c0[1] != ':')) {
                pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_68);
                local_88 = (QChar *)(in_RSI + ((long)local_c0 - (long)pcVar2) * 2);
                goto LAB_002cd6bf;
              }
              local_c0 = local_c0 + 1;
            }
            local_d8 = local_d4 * 2 + local_d8;
            local_d4 = 0;
            local_c0 = local_c0 + 1;
          }
          else {
            QVar5 = qstrntoull(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                               in_stack_fffffffffffffeb4);
            lVar3 = QVar5.used;
            if ((lVar3 < 1) || (4 < lVar3)) {
              pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_68);
              local_88 = (QChar *)(in_RSI + ((long)local_c0 - (long)pcVar2) * 2);
              goto LAB_002cd6bf;
            }
            if (local_c0[lVar3] == '.') {
              if (local_d8 == 0xc) {
                bVar1 = parseIp4Internal((IPv4Address *)in_stack_fffffffffffffea0,
                                         (char *)in_stack_fffffffffffffe98,
                                         SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
                if (bVar1) {
                  *(undefined1 *)((long)in_RDI + 0xc) = 0xaa;
                  *(undefined1 *)((long)in_RDI + 0xd) = 0xaa;
                  *(undefined1 *)((long)in_RDI + 0xe) = 0xaa;
                  *(undefined1 *)((long)in_RDI + 0xf) = 0xaa;
                  local_88 = (QChar *)0x0;
                }
                else {
                  pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_68);
                  local_88 = (QChar *)(in_RSI + ((long)local_c0 - (long)pcVar2) * 2);
                }
              }
              else {
                pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_68);
                local_88 = (QChar *)(in_RSI + ((long)local_c0 - (long)pcVar2) * 2);
              }
              goto LAB_002cd6bf;
            }
            iVar4 = local_d8 + 1;
            *(char *)((long)in_RDI + (long)local_d8) = QVar5.result._1_1_;
            local_d8 = local_d8 + 2;
            *(char *)((long)in_RDI + (long)iVar4) = (char)QVar5.result;
            if (local_c0[lVar3] == '\0') break;
            if (local_c0[lVar3] != ':') {
              local_c0 = local_c0 + lVar3;
              pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_68);
              local_88 = (QChar *)(in_RSI + ((long)local_c0 - (long)pcVar2) * 2);
              goto LAB_002cd6bf;
            }
            local_c0 = local_c0 + lVar3 + 1;
          }
        }
        local_178 = in_RDX;
        if (local_d8 == 0x10) {
          local_178 = (QChar *)0x0;
        }
        local_88 = local_178;
      }
    }
  }
LAB_002cd6bf:
  QVarLengthArray<char,_64LL>::~QVarLengthArray(in_stack_fffffffffffffe80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_88;
}

Assistant:

const QChar *parseIp6(IPv6Address &address, const QChar *begin, const QChar *end)
{
    Q_ASSERT(begin != end);
    Buffer buffer;
    const QChar *ret = checkedToAscii(buffer, begin, end);
    if (ret)
        return ret;

    const char *ptr = buffer.data();
    const char *const stop = ptr + buffer.size();

    // count the colons
    int colonCount = 0;
    int dotCount = 0;
    while (*ptr) {
        if (*ptr == ':')
            ++colonCount;
        if (*ptr == '.')
            ++dotCount;
        ++ptr;
    }
    // IPv4-in-IPv6 addresses are stricter in what they accept
    if (dotCount != 0 && dotCount != 3)
        return end;

    memset(address, 0, sizeof address);
    if (colonCount == 2 && end - begin == 2) // "::"
        return nullptr;

    // if there's a double colon ("::"), this is how many zeroes it means
    int zeroWordsToFill;
    ptr = buffer.data();

    // there are two cases where 8 colons are allowed: at the ends
    // so test that before the colon-count test
    if ((ptr[0] == ':' && ptr[1] == ':') ||
            (ptr[end - begin - 2] == ':' && ptr[end - begin - 1] == ':')) {
        zeroWordsToFill = 9 - colonCount;
    } else if (colonCount < 2 || colonCount > 7) {
        return end;
    } else {
        zeroWordsToFill = 8 - colonCount;
    }
    if (dotCount)
        --zeroWordsToFill;

    int pos = 0;
    while (pos < 15) {
        if (*ptr == ':') {
            // empty field, we hope it's "::"
            if (zeroWordsToFill < 1)
                return begin + (ptr - buffer.data());
            if (pos == 0 || pos == colonCount * 2) {
                if (ptr[0] == '\0' || ptr[1] != ':')
                    return begin + (ptr - buffer.data());
                ++ptr;
            }
            pos += zeroWordsToFill * 2;
            zeroWordsToFill = 0;
            ++ptr;
            continue;
        }

        auto [ll, used] = qstrntoull(ptr, stop - ptr, 16);
        quint16 x = ll;

        // Reject malformed fields:
        // - failed to parse
        // - too many hex digits
        if (used <= 0 || used > 4)
            return begin + (ptr - buffer.data());

        if (ptr[used] == '.') {
            // this could be an IPv4 address
            // it's only valid in the last element
            if (pos != 12)
                return begin + (ptr - buffer.data());

            IPv4Address ip4;
            if (!parseIp4Internal(ip4, ptr, false))
                return begin + (ptr - buffer.data());

            address[12] = ip4 >> 24;
            address[13] = ip4 >> 16;
            address[14] = ip4 >> 8;
            address[15] = ip4;
            return nullptr;
        }

        address[pos++] = x >> 8;
        address[pos++] = x & 0xff;

        if (ptr[used] == '\0')
            break;
        if (ptr[used] != ':')
            return begin + (used + ptr - buffer.data());
        ptr += used + 1;
    }
    return pos == 16 ? nullptr : end;
}